

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

Param * __thiscall
kratos::Generator::parameter(Generator *this,string *parameter_name,uint32_t width,bool is_signed)

{
  element_type *peVar1;
  Generator *local_38;
  undefined1 local_30 [8];
  shared_ptr<kratos::Param> ptr;
  bool is_signed_local;
  uint32_t width_local;
  string *parameter_name_local;
  Generator *this_local;
  
  ptr.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_ =
       is_signed;
  ptr.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = width;
  check_param_name_conflict(this,parameter_name);
  local_38 = this;
  std::make_shared<kratos::Param,kratos::Generator*,std::__cxx11::string_const&,unsigned_int&,bool&>
            ((Generator **)local_30,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38,
             (uint *)parameter_name,
             (bool *)((long)&ptr.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 4));
  std::
  map<std::__cxx11::string,std::shared_ptr<kratos::Param>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>>
  ::emplace<std::__cxx11::string_const&,std::shared_ptr<kratos::Param>&>
            ((map<std::__cxx11::string,std::shared_ptr<kratos::Param>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>>
              *)&this->params_,parameter_name,(shared_ptr<kratos::Param> *)local_30);
  peVar1 = std::__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                     )local_30);
  std::shared_ptr<kratos::Param>::~shared_ptr((shared_ptr<kratos::Param> *)local_30);
  return peVar1;
}

Assistant:

Param &Generator::parameter(const std::string &parameter_name, uint32_t width, bool is_signed) {
    check_param_name_conflict(parameter_name);
    auto ptr = std::make_shared<Param>(this, parameter_name, width, is_signed);
    params_.emplace(parameter_name, ptr);
    return *ptr;
}